

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

void Nwk_ManLevel_rec(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  uint uVar1;
  int iVar2;
  int i;
  Nwk_Obj_t *pNVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  
  iVar4 = pObj->pMan->nTravIds;
  if (pObj->TravId != iVar4) {
    p = pObj->pMan->pManTime;
    pObj->TravId = iVar4;
    uVar1 = *(uint *)&pObj->field_0x20 & 7;
    if (uVar1 - 2 < 2) {
      iVar4 = 0;
      for (lVar5 = 0;
          (lVar5 < pObj->nFanins && (pNVar3 = pObj->pFanio[lVar5], pNVar3 != (Nwk_Obj_t *)0x0));
          lVar5 = lVar5 + 1) {
        Nwk_ManLevel_rec(pNVar3);
        if (iVar4 <= pNVar3->Level) {
          iVar4 = pNVar3->Level;
        }
      }
      if ((*(uint *)&pObj->field_0x20 & 7) == 3) {
        iVar4 = iVar4 + (uint)(0 < pObj->nFanins);
      }
    }
    else {
      if (uVar1 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                      ,200,"void Nwk_ManLevel_rec(Nwk_Obj_t *)");
      }
      iVar4 = 0;
      if (p != (Tim_Man_t *)0x0) {
        iVar2 = Tim_ManBoxForCi(p,*(uint *)&pObj->field_0x20 >> 7);
        if (-1 < iVar2) {
          i = Tim_ManBoxInputFirst(p,iVar2);
          iVar2 = Tim_ManBoxInputNum(p,iVar2);
          iVar4 = 0;
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
            pNVar3 = Nwk_ManCo(pObj->pMan,i);
            Nwk_ManLevel_rec(pNVar3);
            if (iVar4 <= pNVar3->Level) {
              iVar4 = pNVar3->Level;
            }
            i = i + 1;
          }
          iVar4 = iVar4 + 1;
        }
      }
    }
    pObj->Level = iVar4;
  }
  return;
}

Assistant:

void Nwk_ManLevel_rec( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Nwk_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms, LevelMax = 0;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjIsCi(pObj) )
    {
        if ( pManTime ) 
        {
            iBox = Tim_ManBoxForCi( pManTime, pObj->PioId );
            if ( iBox >= 0 ) // this is not a true PI
            {
                iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Nwk_ManCo(pObj->pMan, iTerm1 + i);
                    Nwk_ManLevel_rec( pNext );
                    if ( LevelMax < Nwk_ObjLevel(pNext) )
                        LevelMax = Nwk_ObjLevel(pNext);
                }
                LevelMax++;
            }
        }
    }
    else if ( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj) )
    {
        Nwk_ObjForEachFanin( pObj, pNext, i )
        {
            Nwk_ManLevel_rec( pNext );
            if ( LevelMax < Nwk_ObjLevel(pNext) )
                LevelMax = Nwk_ObjLevel(pNext);
        }
        if ( Nwk_ObjIsNode(pObj) && Nwk_ObjFaninNum(pObj) > 0 )
            LevelMax++;
    }
    else
        assert( 0 );
    Nwk_ObjSetLevel( pObj, LevelMax );
}